

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYRef<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLogLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYRef<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXsYRef<signed_char> *pGVar8;
  TransformerLogLin *pTVar9;
  ImPlotPlot *pIVar10;
  ImDrawVert *pIVar11;
  ImDrawIdx *pIVar12;
  ImPlotContext *pIVar13;
  ImPlotContext *pIVar14;
  ImDrawIdx IVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  pIVar13 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar5 = pGVar8->Count;
  dVar2 = pGVar8->YRef;
  dVar21 = log10((double)(int)pGVar8->Xs
                              [(long)(((pGVar8->Offset + prim) % iVar5 + iVar5) % iVar5) *
                               (long)pGVar8->Stride] / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar14 = GImPlot;
  pIVar10 = pIVar13->CurrentPlot;
  dVar3 = (pIVar10->XAxis).Range.Min;
  iVar5 = pTVar9->YAxis;
  fVar17 = (float)((((double)(float)(dVar21 / pIVar13->LogDenX) *
                     ((pIVar10->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar13->Mx +
                  (double)pIVar13->PixelRange[iVar5].Min.x);
  fVar18 = (float)((dVar2 - pIVar10->YAxis[iVar5].Range.Min) * pIVar13->My[iVar5] +
                  (double)pIVar13->PixelRange[iVar5].Min.y);
  pGVar8 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar5 = pGVar8->Count;
  dVar2 = pGVar8->YRef;
  dVar21 = log10((double)(int)pGVar8->Xs
                              [(long)(((prim + pGVar8->Offset) % iVar5 + iVar5) % iVar5) *
                               (long)pGVar8->Stride] / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar10 = pIVar14->CurrentPlot;
  dVar3 = (pIVar10->XAxis).Range.Min;
  iVar5 = pTVar9->YAxis;
  fVar22 = (float)((((double)(float)(dVar21 / pIVar14->LogDenX) *
                     ((pIVar10->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar14->Mx +
                  (double)pIVar14->PixelRange[iVar5].Min.x);
  fVar23 = (float)((dVar2 - pIVar10->YAxis[iVar5].Range.Min) * pIVar14->My[iVar5] +
                  (double)pIVar14->PixelRange[iVar5].Min.y);
  fVar19 = fVar18;
  if (fVar23 <= fVar18) {
    fVar19 = fVar23;
  }
  bVar16 = false;
  if ((fVar19 < (cull_rect->Max).y) &&
     (fVar19 = (float)(~-(uint)(fVar23 <= fVar18) & (uint)fVar23 |
                      -(uint)(fVar23 <= fVar18) & (uint)fVar18), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar19 && fVar19 != *pfVar1)) {
    fVar19 = fVar17;
    if (fVar22 <= fVar17) {
      fVar19 = fVar22;
    }
    bVar16 = false;
    if (fVar19 < (cull_rect->Max).x) {
      fVar19 = (float)(~-(uint)(fVar22 <= fVar17) & (uint)fVar22 |
                      -(uint)(fVar22 <= fVar17) & (uint)fVar17);
      bVar16 = (cull_rect->Min).x <= fVar19 && fVar19 != (cull_rect->Min).x;
    }
  }
  if (bVar16 != false) {
    fVar19 = this->Weight;
    IVar6 = this->Col;
    IVar4 = *uv;
    fVar24 = fVar22 - fVar17;
    fVar25 = fVar23 - fVar18;
    fVar20 = fVar24 * fVar24 + fVar25 * fVar25;
    if (0.0 < fVar20) {
      if (fVar20 < 0.0) {
        fVar20 = sqrtf(fVar20);
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      fVar24 = fVar24 * (1.0 / fVar20);
      fVar25 = fVar25 * (1.0 / fVar20);
    }
    fVar19 = fVar19 * 0.5;
    fVar24 = fVar24 * fVar19;
    fVar19 = fVar19 * fVar25;
    pIVar11 = DrawList->_VtxWritePtr;
    (pIVar11->pos).x = fVar19 + fVar17;
    (pIVar11->pos).y = fVar18 - fVar24;
    pIVar11->uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar6;
    pIVar11[1].pos.x = fVar19 + fVar22;
    pIVar11[1].pos.y = fVar23 - fVar24;
    pIVar11[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar22 - fVar19;
    pIVar11[2].pos.y = fVar24 + fVar23;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    pIVar11[3].pos.x = fVar17 - fVar19;
    pIVar11[3].pos.y = fVar24 + fVar18;
    pIVar11[3].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar12 = DrawList->_IdxWritePtr;
    IVar15 = (ImDrawIdx)uVar7;
    *pIVar12 = IVar15;
    pIVar12[1] = IVar15 + 1;
    pIVar12[2] = IVar15 + 2;
    pIVar12[3] = IVar15;
    pIVar12[4] = IVar15 + 2;
    pIVar12[5] = IVar15 + 3;
    DrawList->_IdxWritePtr = pIVar12 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  return bVar16;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }